

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi_cache.cpp
# Opt level: O0

UBool __thiscall icu_63::RuleBasedBreakIterator::BreakCache::populateFollowing(BreakCache *this)

{
  UBool UVar1;
  int local_2c;
  int32_t local_28;
  int count;
  int32_t ruleStatusIdx;
  int32_t pos;
  int32_t fromRuleStatusIdx;
  int32_t fromPosition;
  BreakCache *this_local;
  
  pos = this->fBoundaries[this->fEndBufIdx];
  ruleStatusIdx = (int32_t)this->fStatuses[this->fEndBufIdx];
  count = 0;
  local_28 = 0;
  _fromRuleStatusIdx = this;
  UVar1 = DictionaryCache::following(this->fBI->fDictionaryCache,pos,&count,&local_28);
  if (UVar1 == '\0') {
    this->fBI->fPosition = pos;
    count = handleNext(this->fBI);
    if (count == -1) {
      this_local._7_1_ = '\0';
    }
    else {
      local_28 = this->fBI->fRuleStatusIndex;
      if (this->fBI->fDictionaryCharCount != 0) {
        DictionaryCache::populateDictionary
                  (this->fBI->fDictionaryCache,pos,count,ruleStatusIdx,local_28);
        UVar1 = DictionaryCache::following(this->fBI->fDictionaryCache,pos,&count,&local_28);
        if (UVar1 != '\0') {
          addFollowing(this,count,local_28,UpdateCachePosition);
          return '\x01';
        }
      }
      addFollowing(this,count,local_28,UpdateCachePosition);
      local_2c = 0;
      while (((local_2c < 6 && (count = handleNext(this->fBI), count != -1)) &&
             (this->fBI->fDictionaryCharCount == 0))) {
        addFollowing(this,count,this->fBI->fRuleStatusIndex,RetainCachePosition);
        local_2c = local_2c + 1;
      }
      this_local._7_1_ = '\x01';
    }
  }
  else {
    addFollowing(this,count,local_28,UpdateCachePosition);
    this_local._7_1_ = '\x01';
  }
  return this_local._7_1_;
}

Assistant:

UBool RuleBasedBreakIterator::BreakCache::populateFollowing() {
    int32_t fromPosition = fBoundaries[fEndBufIdx];
    int32_t fromRuleStatusIdx = fStatuses[fEndBufIdx];
    int32_t pos = 0;
    int32_t ruleStatusIdx = 0;

    if (fBI->fDictionaryCache->following(fromPosition, &pos, &ruleStatusIdx)) {
        addFollowing(pos, ruleStatusIdx, UpdateCachePosition);
        return TRUE;
    }

    fBI->fPosition = fromPosition;
    pos = fBI->handleNext();
    if (pos == UBRK_DONE) {
        return FALSE;
    }

    ruleStatusIdx = fBI->fRuleStatusIndex;
    if (fBI->fDictionaryCharCount > 0) {
        // The text segment obtained from the rules includes dictionary characters.
        // Subdivide it, with subdivided results going into the dictionary cache.
        fBI->fDictionaryCache->populateDictionary(fromPosition, pos, fromRuleStatusIdx, ruleStatusIdx);
        if (fBI->fDictionaryCache->following(fromPosition, &pos, &ruleStatusIdx)) {
            addFollowing(pos, ruleStatusIdx, UpdateCachePosition);
            return TRUE;
            // TODO: may want to move a sizable chunk of dictionary cache to break cache at this point.
            //       But be careful with interactions with populateNear().
        }
    }

    // Rule based segment did not include dictionary characters.
    // Or, it did contain dictionary chars, but the dictionary segmenter didn't handle them,
    //    meaning that we didn't take the return, above.
    // Add its end point to the cache.
    addFollowing(pos, ruleStatusIdx, UpdateCachePosition);

    // Add several non-dictionary boundaries at this point, to optimize straight forward iteration.
    //    (subsequent calls to BreakIterator::next() will take the fast path, getting cached results.
    //
    for (int count=0; count<6; ++count) {
        pos = fBI->handleNext();
        if (pos == UBRK_DONE || fBI->fDictionaryCharCount > 0) {
            break;
        }
        addFollowing(pos, fBI->fRuleStatusIndex, RetainCachePosition);
    }

    return TRUE;
}